

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::audit_feature(audit_results *dat,float ft_weight,uint64_t ft_idx)

{
  parameters *this;
  float fVar1;
  pointer pbVar2;
  shared_data *psVar3;
  uint64_t *puVar4;
  ostream *poVar5;
  weight *pwVar6;
  size_type sVar7;
  ulong i;
  vw *pvVar8;
  string *s;
  pointer pbVar9;
  float fVar10;
  float fVar11;
  string ns_pre;
  string_value sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream tempstream;
  
  pvVar8 = dat->all;
  this = &pvVar8->weights;
  puVar4 = &(pvVar8->weights).dense_weights._weight_mask;
  if ((pvVar8->weights).sparse != false) {
    puVar4 = &(pvVar8->weights).sparse_weights._weight_mask;
  }
  i = ft_idx & *puVar4;
  ns_pre._M_dataplus._M_p = (pointer)&ns_pre.field_2;
  ns_pre._M_string_length = 0;
  ns_pre.field_2._M_local_buf[0] = '\0';
  pbVar2 = (dat->ns_pre).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (dat->ns_pre).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
    std::__cxx11::string::append((string *)&ns_pre);
  }
  pvVar8 = dat->all;
  if (pvVar8->audit != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tempstream);
    poVar5 = std::operator<<((ostream *)&tempstream,':');
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,ft_weight);
    poVar5 = std::operator<<(poVar5,':');
    pwVar6 = parameters::operator[](this,i);
    fVar1 = *pwVar6;
    psVar3 = dat->all->sd;
    fVar10 = (float)psVar3->gravity;
    fVar11 = 0.0;
    if (fVar10 < ABS(fVar1)) {
      fVar11 = fVar10 * *(float *)(&DAT_00233560 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
    }
    std::ostream::operator<<(poVar5,(float)psVar3->contraction * fVar11);
    if (dat->all->adaptive == true) {
      poVar5 = std::operator<<((ostream *)&tempstream,'@');
      pwVar6 = parameters::operator[](this,i);
      std::ostream::operator<<(poVar5,pwVar6[1]);
    }
    pwVar6 = parameters::operator[](this,i);
    sv.v = ft_weight * *pwVar6;
    std::__cxx11::stringbuf::str();
    std::operator+(&sv.s,&ns_pre,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::vector<GD::string_value,_std::allocator<GD::string_value>_>::push_back(&dat->results,&sv);
    std::__cxx11::string::~string((string *)&sv.s);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tempstream);
    pvVar8 = dat->all;
  }
  if (((pvVar8->current_pass == 0) || (pvVar8->training == false)) && (pvVar8->hash_inv == true)) {
    if (dat->offset != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tempstream);
      poVar5 = std::operator<<((ostream *)&tempstream,'[');
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,']');
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)&ns_pre);
      std::__cxx11::string::~string((string *)&sv);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tempstream);
      pvVar8 = dat->all;
    }
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::count(&pvVar8->name_index_map,&ns_pre);
    if (sVar7 == 0) {
      pvVar8 = dat->all;
      std::__cxx11::string::string((string *)&tempstream,(string *)&ns_pre);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)&pvVar8->name_index_map,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)&tempstream);
      std::__cxx11::string::~string((string *)&tempstream);
    }
  }
  std::__cxx11::string::~string((string *)&ns_pre);
  return;
}

Assistant:

inline void audit_feature(audit_results& dat, const float ft_weight, const uint64_t ft_idx)
{
  parameters& weights = dat.all.weights;
  uint64_t index = ft_idx & weights.mask();
  size_t stride_shift = weights.stride_shift();

  string ns_pre;
  for (string& s : dat.ns_pre) ns_pre += s;

  if (dat.all.audit)
  {
    ostringstream tempstream;
    tempstream << ':' << (index >> stride_shift) << ':' << ft_weight << ':'
               << trunc_weight(weights[index], (float)dat.all.sd->gravity) * (float)dat.all.sd->contraction;

    if (dat.all.adaptive)
      tempstream << '@' << (&weights[index])[1];

    string_value sv = {weights[index] * ft_weight, ns_pre + tempstream.str()};
    dat.results.push_back(sv);
  }

  if ((dat.all.current_pass == 0 || dat.all.training == false) && dat.all.hash_inv)
  {
    // for invert_hash

    if (dat.offset != 0)
    {
      // otherwise --oaa output no features for class > 0.
      ostringstream tempstream;
      tempstream << '[' << (dat.offset >> stride_shift) << ']';
      ns_pre += tempstream.str();
    }

    if (!dat.all.name_index_map.count(ns_pre))
      dat.all.name_index_map.insert(std::map<std::string, size_t>::value_type(ns_pre, index >> stride_shift));
  }
}